

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

void duckdb::DeserializeNumericStatsValue
               (LogicalType *type,NumericValueUnion *result,bool *has_stats,
               Deserializer *deserializer)

{
  PhysicalType PVar1;
  bool bVar2;
  uchar uVar3;
  unsigned_short uVar4;
  uint uVar5;
  unsigned_long uVar6;
  InternalException *this;
  float fVar7;
  double dVar8;
  uhugeint_t uVar9;
  allocator local_49;
  string local_48;
  
  bVar2 = Deserializer::ReadProperty<bool>(deserializer,100,"has_value");
  if (!bVar2) {
    *has_stats = false;
    return;
  }
  *has_stats = true;
  PVar1 = type->physical_type_;
  switch(PVar1) {
  case BOOL:
    uVar3 = Deserializer::ReadProperty<bool>(deserializer,0x65,"value");
    goto LAB_005149d4;
  case UINT8:
    uVar3 = Deserializer::ReadProperty<unsigned_char>(deserializer,0x65,"value");
    goto LAB_005149d4;
  case INT8:
    uVar3 = Deserializer::ReadProperty<signed_char>(deserializer,0x65,"value");
LAB_005149d4:
    (result->value_).tinyint = uVar3;
    break;
  case UINT16:
    uVar4 = Deserializer::ReadProperty<unsigned_short>(deserializer,0x65,"value");
    goto LAB_0051498e;
  case INT16:
    uVar4 = Deserializer::ReadProperty<short>(deserializer,0x65,"value");
LAB_0051498e:
    (result->value_).smallint = uVar4;
    break;
  case UINT32:
    uVar5 = Deserializer::ReadProperty<unsigned_int>(deserializer,0x65,"value");
    goto LAB_005149ed;
  case INT32:
    uVar5 = Deserializer::ReadProperty<int>(deserializer,0x65,"value");
LAB_005149ed:
    (result->value_).integer = uVar5;
    break;
  case UINT64:
    uVar6 = Deserializer::ReadProperty<unsigned_long>(deserializer,0x65,"value");
    goto LAB_00514a35;
  case INT64:
    uVar6 = Deserializer::ReadProperty<long>(deserializer,0x65,"value");
LAB_00514a35:
    (result->value_).bigint = uVar6;
    break;
  case UINT64|UINT8:
switchD_005148fa_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"Unsupported type for serializing numeric statistics",&local_49);
    InternalException::InternalException(this,&local_48);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    fVar7 = Deserializer::ReadProperty<float>(deserializer,0x65,"value");
    (result->value_).float_ = fVar7;
    break;
  case DOUBLE:
    dVar8 = Deserializer::ReadProperty<double>(deserializer,0x65,"value");
    (result->value_).double_ = dVar8;
    break;
  default:
    if (PVar1 == UINT128) {
      uVar9 = Deserializer::ReadProperty<duckdb::uhugeint_t>(deserializer,0x65,"value");
    }
    else {
      if (PVar1 != INT128) goto switchD_005148fa_caseD_a;
      uVar9 = (uhugeint_t)Deserializer::ReadProperty<duckdb::hugeint_t>(deserializer,0x65,"value");
    }
    *(uint64_t *)&result->value_ = uVar9.lower;
    *(uint64_t *)((long)&result->value_ + 8) = uVar9.upper;
  }
  return;
}

Assistant:

static void DeserializeNumericStatsValue(const LogicalType &type, NumericValueUnion &result, bool &has_stats,
                                         Deserializer &deserializer) {
	auto has_value = deserializer.ReadProperty<bool>(100, "has_value");
	if (!has_value) {
		has_stats = false;
		return;
	}
	has_stats = true;
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		result.value_.boolean = deserializer.ReadProperty<bool>(101, "value");
		break;
	case PhysicalType::INT8:
		result.value_.tinyint = deserializer.ReadProperty<int8_t>(101, "value");
		break;
	case PhysicalType::INT16:
		result.value_.smallint = deserializer.ReadProperty<int16_t>(101, "value");
		break;
	case PhysicalType::INT32:
		result.value_.integer = deserializer.ReadProperty<int32_t>(101, "value");
		break;
	case PhysicalType::INT64:
		result.value_.bigint = deserializer.ReadProperty<int64_t>(101, "value");
		break;
	case PhysicalType::UINT8:
		result.value_.utinyint = deserializer.ReadProperty<uint8_t>(101, "value");
		break;
	case PhysicalType::UINT16:
		result.value_.usmallint = deserializer.ReadProperty<uint16_t>(101, "value");
		break;
	case PhysicalType::UINT32:
		result.value_.uinteger = deserializer.ReadProperty<uint32_t>(101, "value");
		break;
	case PhysicalType::UINT64:
		result.value_.ubigint = deserializer.ReadProperty<uint64_t>(101, "value");
		break;
	case PhysicalType::INT128:
		result.value_.hugeint = deserializer.ReadProperty<hugeint_t>(101, "value");
		break;
	case PhysicalType::UINT128:
		result.value_.uhugeint = deserializer.ReadProperty<uhugeint_t>(101, "value");
		break;
	case PhysicalType::FLOAT:
		result.value_.float_ = deserializer.ReadProperty<float>(101, "value");
		break;
	case PhysicalType::DOUBLE:
		result.value_.double_ = deserializer.ReadProperty<double>(101, "value");
		break;
	default:
		throw InternalException("Unsupported type for serializing numeric statistics");
	}
}